

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbuffer.c
# Opt level: O0

void bounded_buffer_put(bounded_buffer_t *bb,entry_t *item)

{
  int iVar1;
  entry_t *item_local;
  bounded_buffer_t *bb_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&bb->lock);
  while (bb->size <= bb->tail - bb->head) {
    pthread_cond_wait((pthread_cond_t *)&bb->has_space,(pthread_mutex_t *)&bb->lock);
  }
  iVar1 = bb->tail;
  bb->tail = iVar1 + 1;
  bb->entries[iVar1 % bb->size] = item;
  pthread_cond_signal((pthread_cond_t *)&bb->has_items);
  pthread_mutex_unlock((pthread_mutex_t *)&bb->lock);
  return;
}

Assistant:

void bounded_buffer_put(bounded_buffer_t* bb, entry_t* item)
{
    pthread_mutex_lock(&bb->lock);

    while (bb->tail - bb->head >= bb->size)
    {
        pthread_cond_wait(&bb->has_space, &bb->lock);
    }

    bb->entries[bb->tail++ % bb->size] = item;
    pthread_cond_signal(&bb->has_items);

    pthread_mutex_unlock(&bb->lock);
}